

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::handleOverflow(IEEEFloat *this,roundingMode rounding_mode)

{
  byte bVar1;
  uint bits;
  Significand *dst;
  
  bVar1 = this->field_0x12;
  if ((rounding_mode & ~rmNearestTiesToAway) != rmNearestTiesToEven) {
    if (rounding_mode == rmTowardNegative) {
      if ((bVar1 & 8) == 0) goto LAB_001324e4;
    }
    else if ((rounding_mode != rmTowardPositive) || ((bVar1 & 8) != 0)) {
LAB_001324e4:
      this->field_0x12 = bVar1 & 0xf8 | 2;
      this->exponent = this->semantics->maxExponent;
      bits = this->semantics->precision;
      if (bits - 0x40 < 0xffffff80) {
        dst = (Significand *)(this->significand).parts;
      }
      else {
        dst = &this->significand;
      }
      APInt::tcSetLeastSignificantBits(&dst->part,bits + 0x40 >> 6,bits);
      return opInexact;
    }
  }
  this->field_0x12 = bVar1 & 0xf8;
  return opInexact|opOverflow;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::handleOverflow(roundingMode rounding_mode) {
  /* Infinity?  */
  if (rounding_mode == rmNearestTiesToEven ||
      rounding_mode == rmNearestTiesToAway ||
      (rounding_mode == rmTowardPositive && !sign) ||
      (rounding_mode == rmTowardNegative && sign)) {
    category = fcInfinity;
    return (opStatus) (opOverflow | opInexact);
  }

  /* Otherwise we become the largest finite number.  */
  category = fcNormal;
  exponent = semantics->maxExponent;
  APInt::tcSetLeastSignificantBits(significandParts(), partCount(),
                                   semantics->precision);

  return opInexact;
}